

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.h
# Opt level: O0

void __thiscall
AddPropertyCacheBucket::Copy(AddPropertyCacheBucket *this,AddPropertyCacheBucket *pNew)

{
  AddPropertyCacheBucket *pNew_local;
  AddPropertyCacheBucket *this_local;
  
  (pNew->initialType).t = (this->initialType).t;
  (pNew->finalType).t = (this->finalType).t;
  (pNew->deadStoreUnavailableInitialType).t = (this->deadStoreUnavailableInitialType).t;
  (pNew->deadStoreUnavailableFinalType).t = (this->deadStoreUnavailableFinalType).t;
  return;
}

Assistant:

void Copy(AddPropertyCacheBucket *pNew) const
    {
        pNew->initialType = this->initialType;
        pNew->finalType = this->finalType;
#if DBG
        pNew->deadStoreUnavailableInitialType = this->deadStoreUnavailableInitialType;
        pNew->deadStoreUnavailableFinalType = this->deadStoreUnavailableFinalType;
#endif
    }